

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

uint32_t llama_sampler_get_seed(llama_sampler *smpl)

{
  llama_sampler_i *plVar1;
  long lVar2;
  long lVar3;
  uint32_t uVar4;
  uint32_t unaff_EBX;
  long lVar5;
  
  plVar1 = smpl->iface;
  if (plVar1 != &llama_sampler_dist_i) {
    if (plVar1 == &llama_sampler_mirostat_i) {
      return *(uint32_t *)((long)smpl->ctx + 8);
    }
    if (plVar1 != &llama_sampler_mirostat_v2_i) {
      if (plVar1 == &llama_sampler_chain_i) {
        lVar2 = *(long *)((long)smpl->ctx + 8);
        lVar3 = *(long *)((long)smpl->ctx + 0x10);
        do {
          lVar5 = lVar3;
          uVar4 = unaff_EBX;
          if (lVar5 == lVar2) break;
          uVar4 = llama_sampler_get_seed(*(llama_sampler **)(lVar5 + -8));
          lVar3 = lVar5 + -8;
        } while (uVar4 == 0xffffffff);
        if (lVar5 != lVar2) {
          return uVar4;
        }
      }
      return 0xffffffff;
    }
  }
  return *(uint32_t *)((long)smpl->ctx + 4);
}

Assistant:

uint32_t llama_sampler_get_seed(const struct llama_sampler * smpl) {
    if (smpl->iface == &llama_sampler_dist_i) {
        return ((const llama_sampler_dist *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_mirostat_i) {
        return ((const llama_sampler_mirostat *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_mirostat_v2_i) {
        return ((const llama_sampler_mirostat_v2 *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_chain_i) {
        const auto * ctx = (const llama_sampler_chain *) smpl->ctx;
        for (auto it = ctx->samplers.rbegin(); it != ctx->samplers.rend(); ++it) {
            const uint32_t seed = llama_sampler_get_seed(*it);
            if (seed != LLAMA_DEFAULT_SEED) {
                return seed;
            }
        }
    }

    return LLAMA_DEFAULT_SEED;
}